

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O2

void __thiscall
TaprootScriptTree_TreeTestContainBranchHash_Test::TestBody
          (TaprootScriptTree_TreeTestContainBranchHash_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_128;
  Script local_120;
  string tree_str;
  string tapscript;
  TaprootScriptTree tree;
  
  std::__cxx11::string::string
            ((string *)&tree_str,
             "{af151388d3bfbebcdc87e4a0b4a97bbfa378f2e5a909eb38a6978cb2a71f39c4,tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}"
             ,(allocator *)&tree);
  std::__cxx11::string::string
            ((string *)&tapscript,
             "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac"
             ,(allocator *)&tree);
  cfd::core::Script::Script(&local_120,&tapscript);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  cfd::core::TaprootScriptTree::FromString
            (&tree,&tree_str,&local_120,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&gtest_ar,
             kMainnet);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&gtest_ar);
  cfd::core::Script::~Script(&local_120);
  cfd::core::TapBranch::ToString_abi_cxx11_((string *)&local_120,&tree.super_TapBranch);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"tree_str","tree.ToString()",&tree_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_120);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x266,message);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_120);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  std::__cxx11::string::~string((string *)&tapscript);
  std::__cxx11::string::~string((string *)&tree_str);
  return;
}

Assistant:

TEST(TaprootScriptTree, TreeTestContainBranchHash) {
  std::string tree_str = "{af151388d3bfbebcdc87e4a0b4a97bbfa378f2e5a909eb38a6978cb2a71f39c4,tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}";
  std::string tapscript = "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac";

  try {
    auto tree = TaprootScriptTree::FromString(tree_str, Script(tapscript));
    EXPECT_EQ(tree_str, tree.ToString());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}